

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O1

bool __thiscall CDirectiveFile::Validate(CDirectiveFile *this)

{
  (*Arch->_vptr_CArchitecture[2])();
  if (this->type < Close) {
    FileManager::openFile(g_fileManager,&this->file->super_AssemblerFile,true);
  }
  else if (this->type == Close) {
    FileManager::closeFile(g_fileManager);
  }
  return false;
}

Assistant:

bool CDirectiveFile::Validate()
{
	Arch->NextSection();

	switch (type)
	{
	case Type::Open:
	case Type::Create:
	case Type::Copy:
		g_fileManager->openFile(file,true);
		return false;
	case Type::Close:
		g_fileManager->closeFile();
		return false;
	}

	return false;
}